

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmanager.cpp
# Opt level: O1

void __thiscall camp::detail::ClassManager::~ClassManager(ClassManager *this)

{
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
  *poVar1;
  pointer poVar2;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
  *poVar3;
  ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
  *local_20;
  
  poVar1 = (this->m_classes).
           super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_*,_boost::multi_index::multi_index_container<camp::detail::ClassManager::ClassInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>
           .member;
  poVar2 = (poVar1->
           super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
           ).
           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .
           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .super_type.left_;
  poVar3 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
            *)&poVar2[-5].
               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
               .super_type.right_;
  if (poVar2 == (pointer)0x0) {
    poVar3 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
              *)0x0;
  }
  if (poVar3 != poVar1) {
    do {
      ObserverNotifier::notifyClassRemoved
                (&this->super_ObserverNotifier,
                 *(Class **)
                  ((long)&(poVar3->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>
                          ).
                          super_index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>
                          .super_pod_value_holder<camp::detail::ClassManager::ClassInfo>.space.data_
                  + 0x40));
      local_20 = &poVar3->
                  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
      ;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)&local_20);
      poVar3 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
                *)((long)(local_20 + -5) + 0x10);
      if (local_20 ==
          (ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
           *)0x0) {
        poVar3 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
                  *)0x0;
      }
    } while (poVar3 != (this->m_classes).
                       super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_*,_boost::multi_index::multi_index_container<camp::detail::ClassManager::ClassInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>
                       .member);
  }
  boost::multi_index::
  multi_index_container<camp::detail::ClassManager::ClassInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::ClassManager::ClassInfo>_>
  ::~multi_index_container(&this->m_classes);
  std::
  _Rb_tree<camp::Observer_*,_camp::Observer_*,_std::_Identity<camp::Observer_*>,_std::less<camp::Observer_*>,_std::allocator<camp::Observer_*>_>
  ::~_Rb_tree((_Rb_tree<camp::Observer_*,_camp::Observer_*,_std::_Identity<camp::Observer_*>,_std::less<camp::Observer_*>,_std::allocator<camp::Observer_*>_>
               *)this);
  return;
}

Assistant:

ClassManager::~ClassManager()
{
    // Notify observers
    for (ClassTable::const_iterator it = m_classes.begin(); it != m_classes.end(); ++it)
    {
        notifyClassRemoved(*it->classPtr);
    }
}